

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::reverse_vertical(Image *this)

{
  ulong uVar1;
  long lVar2;
  ssize_t sVar3;
  ulong y;
  long x;
  uint64_t a1;
  uint64_t r1;
  uint64_t a2;
  uint64_t b2;
  uint64_t g2;
  uint64_t r2;
  uint64_t b1;
  uint64_t g1;
  uint64_t local_78;
  uint64_t local_70;
  ulong local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  sVar3 = this->height;
  if (1 < sVar3) {
    lVar2 = this->width;
    y = 0;
    do {
      if (0 < lVar2) {
        local_68 = ~y;
        x = 0;
        do {
          read_pixel(this,x,y,&local_70,&local_38,&local_40,&local_78);
          uVar1 = local_68;
          read_pixel(this,x,this->height + local_68,&local_48,&local_50,&local_58,&local_60);
          write_pixel(this,x,this->height + uVar1,local_70,local_38,local_40,local_78);
          write_pixel(this,x,y,local_48,local_50,local_58,local_60);
          x = x + 1;
          lVar2 = this->width;
        } while (x < lVar2);
        sVar3 = this->height;
      }
      y = y + 1;
    } while ((long)y < sVar3 / 2);
  }
  return;
}

Assistant:

void Image::reverse_vertical() {
  for (ssize_t y = 0; y < this->height / 2; y++) {
    for (ssize_t x = 0; x < this->width; x++) {
      uint64_t r1, g1, b1, a1, r2, g2, b2, a2;
      this->read_pixel(x, y, &r1, &g1, &b1, &a1);
      this->read_pixel(x, this->height - y - 1, &r2, &g2, &b2, &a2);
      this->write_pixel(x, this->height - y - 1, r1, g1, b1, a1);
      this->write_pixel(x, y, r2, g2, b2, a2);
    }
  }
}